

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x64ADD(uchar *stream,x86Reg dst,int num)

{
  int iVar1;
  byte bVar2;
  
  *stream = 8 < (int)dst | 0x48;
  if ((char)(uchar)num == num) {
    stream[1] = 0x83;
    bVar2 = regCode[dst];
    stream[3] = (uchar)num;
    iVar1 = 4;
  }
  else {
    stream[1] = 0x81;
    bVar2 = regCode[dst];
    *(int *)(stream + 3) = num;
    iVar1 = 7;
  }
  stream[2] = bVar2 | 0xc0;
  return iVar1;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}